

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O2

void hashtable_do_clear(hashtable_t *hashtable)

{
  hashtable_list *phVar1;
  hashtable_list *ptr;
  
  ptr = (hashtable->list).next;
  while (ptr != &hashtable->list) {
    phVar1 = ptr->next;
    json_decref((json_t *)ptr[2].next);
    jsonp_free(ptr);
    ptr = phVar1;
  }
  return;
}

Assistant:

static void hashtable_do_clear(hashtable_t *hashtable)
{
    list_t *list, *next;
    pair_t *pair;

    for(list = hashtable->list.next; list != &hashtable->list; list = next)
    {
        next = list->next;
        pair = list_to_pair(list);
        json_decref(pair->value);
        jsonp_free(pair);
    }
}